

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_winzip_aes_large.c
# Opt level: O0

void test_read_format_zip_winzip_aes256_large(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *_a;
  archive_conflict *paVar4;
  char *pcVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  undefined1 local_228 [8];
  char buff [512];
  archive *a;
  archive_entry *ae;
  char *refname;
  
  ae = (archive_entry *)anon_var_dwarf_16c64;
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                   ,L'%',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_zip(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                      ,L'&',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",_a);
  iVar1 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",_a);
  iVar1 = archive_write_set_options(_a,"zip:encryption=aes256");
  if (iVar1 == 0) {
    archive_write_free(_a);
    extract_reference_file((char *)ae);
    paVar4 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                     ,L'6',(uint)(paVar4 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4
                       );
    iVar1 = archive_read_support_format_all((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4
                       );
    wVar2 = archive_read_open_filename(paVar4,(char *)ae,0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L':',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paVar4);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'=',-1,"ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW",(long)iVar1,
                        "archive_read_has_encrypted_entries(a)",paVar4);
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'A',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
               ,L'B',"Makefile","\"Makefile\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0'
              );
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'C',0x163a6b,"1456747",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'D',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
    wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'E',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",
                        (void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'F',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",paVar4);
    lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'G',-0x19,"ARCHIVE_FAILED",lVar7,
                        "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'K',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
               ,L'L',"NEWS","\"NEWS\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'M',0x72ad,"29357",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'N',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
    wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'O',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",
                        (void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'P',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",paVar4);
    lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Q',-0x19,"ARCHIVE_FAILED",lVar7,
                        "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'T',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'U',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
               ,L'V',"README","\"README\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'W',0x1aa2,"6818",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'X',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
    wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Y',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",
                        (void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Z',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",paVar4);
    lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'[',-0x19,"ARCHIVE_FAILED",lVar7,
                        "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'_',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
               ,L'`',"config.h","\"config.h\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0'
              );
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'a',0x7f9b,"32667",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'b',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
    wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'c',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",
                        (void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'd',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",paVar4);
    lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'e',-0x19,"ARCHIVE_FAILED",lVar7,
                        "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
    iVar1 = archive_file_count((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'g',4,"4",(long)iVar1,"archive_file_count(a)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'j',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    iVar1 = archive_filter_code((archive *)paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'm',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",paVar4
                       );
    iVar1 = archive_format((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'n',0x50000,"ARCHIVE_FORMAT_ZIP",(long)iVar1,"archive_format(a)",paVar4);
    iVar1 = archive_read_close((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    paVar4 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                     ,L'x',(uint)(paVar4 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'y',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4
                       );
    iVar1 = archive_read_support_format_all((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4
                       );
    iVar1 = archive_read_add_passphrase((archive *)paVar4,"password");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'|',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_add_passphrase(a, \"password\")",paVar4);
    wVar2 = archive_read_open_filename(paVar4,(char *)ae,0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'~',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paVar4);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x81',-1,"ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW",(long)iVar1,
                        "archive_read_has_encrypted_entries(a)",paVar4);
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paVar4);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x85',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
               ,L'\x86',"Makefile","\"Makefile\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
               L'\0');
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x87',0x163a6b,"1456747",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x88',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0
                       );
    wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x89',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",
                        (void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x8a',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",paVar4);
    pcVar5 = archive_zlib_version();
    if (pcVar5 == (char *)0x0) {
      lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                          ,L'\x8f',-0x19,"ARCHIVE_FAILED",lVar7,
                          "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
      pcVar5 = archive_error_string((archive *)paVar4);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                 ,L'\x91',pcVar5,"archive_error_string(a)",
                 "Unsupported ZIP compression method (8: deflation)",
                 "\"Unsupported ZIP compression method (8: deflation)\"",(void *)0x0,L'\0');
      iVar1 = archive_errno((archive *)paVar4);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                       ,L'\x92',(uint)(iVar1 != 0),"archive_errno(a) != 0",(void *)0x0);
    }
    else {
      lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                          ,L'\x8c',0x200,"512",lVar7,"archive_read_data(a, buff, sizeof(buff))",
                          (void *)0x0);
    }
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x96',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paVar4);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x97',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
               ,L'\x98',"NEWS","\"NEWS\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x99',0x72ad,"29357",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x9a',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0
                       );
    wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x9b',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",
                        (void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'\x9c',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",paVar4);
    pcVar5 = archive_zlib_version();
    if (pcVar5 == (char *)0x0) {
      lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                          ,L'¡',-0x19,"ARCHIVE_FAILED",lVar7,
                          "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
      pcVar5 = archive_error_string((archive *)paVar4);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                 ,L'£',pcVar5,"archive_error_string(a)",
                 "Unsupported ZIP compression method (8: deflation)",
                 "\"Unsupported ZIP compression method (8: deflation)\"",(void *)0x0,L'\0');
      iVar1 = archive_errno((archive *)paVar4);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                       ,L'¤',(uint)(iVar1 != 0),"archive_errno(a) != 0",(void *)0x0);
    }
    else {
      lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                          ,L'\x9e',0x200,"512",lVar7,"archive_read_data(a, buff, sizeof(buff))",
                          (void *)0x0);
    }
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'¨',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'©',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
               ,L'ª',"README","\"README\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'«',0x1aa2,"6818",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'¬',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
    wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'­',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",
                        (void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'®',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",paVar4);
    pcVar5 = archive_zlib_version();
    if (pcVar5 == (char *)0x0) {
      lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                          ,L'³',-0x19,"ARCHIVE_FAILED",lVar7,
                          "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
      pcVar5 = archive_error_string((archive *)paVar4);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                 ,L'µ',pcVar5,"archive_error_string(a)",
                 "Unsupported ZIP compression method (8: deflation)",
                 "\"Unsupported ZIP compression method (8: deflation)\"",(void *)0x0,L'\0');
      iVar1 = archive_errno((archive *)paVar4);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                       ,L'¶',(uint)(iVar1 != 0),"archive_errno(a) != 0",(void *)0x0);
    }
    else {
      lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                          ,L'°',0x200,"512",lVar7,"archive_read_data(a, buff, sizeof(buff))",
                          (void *)0x0);
    }
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'º',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'»',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
               ,L'¼',"config.h","\"config.h\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
               L'\0');
    lVar6 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'½',0x7f9b,"32667",lVar6,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'¾',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
    wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'¿',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",
                        (void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'À',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",paVar4);
    pcVar5 = archive_zlib_version();
    if (pcVar5 == (char *)0x0) {
      lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                          ,L'Å',-0x19,"ARCHIVE_FAILED",lVar7,
                          "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
      pcVar5 = archive_error_string((archive *)paVar4);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                 ,L'Ç',pcVar5,"archive_error_string(a)",
                 "Unsupported ZIP compression method (8: deflation)",
                 "\"Unsupported ZIP compression method (8: deflation)\"",(void *)0x0,L'\0');
      iVar1 = archive_errno((archive *)paVar4);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                       ,L'È',(uint)(iVar1 != 0),"archive_errno(a) != 0",(void *)0x0);
    }
    else {
      lVar7 = archive_read_data((archive *)paVar4,local_228,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                          ,L'Â',0x200,"512",lVar7,"archive_read_data(a, buff, sizeof(buff))",
                          (void *)0x0);
    }
    iVar1 = archive_file_count((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Ë',4,"4",(long)iVar1,"archive_file_count(a)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Î',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                       );
    iVar1 = archive_filter_code((archive *)paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Ñ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                        paVar4);
    iVar1 = archive_format((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Ò',0x50000,"ARCHIVE_FORMAT_ZIP",(long)iVar1,"archive_format(a)",paVar4);
    iVar1 = archive_read_close((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Õ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                        ,L'Ö',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_winzip_aes_large.c"
                   ,L'*');
    test_skipping("This system does not have cryptographic library");
    archive_write_free(_a);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_winzip_aes256_large)
{
	const char *refname = "test_read_format_zip_winzip_aes256_large.zip";
	struct archive_entry *ae;
	struct archive *a;
	char buff[512];


	/* Check if running system has cryptographic functionality. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	if (ARCHIVE_OK != archive_write_set_options(a,
				"zip:encryption=aes256")) {
		skipping("This system does not have cryptographic library");
		archive_write_free(a);
		return;
	}
	archive_write_free(a);


	extract_reference_file(refname);

	/*
	 * Extract a zip file without password.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, 
               archive_read_open_filename(a, refname, 10240));

	assertEqualIntA(a, ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW,
		archive_read_has_encrypted_entries(a));

	/* Verify encrypted file "Makefile" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("Makefile", archive_entry_pathname(ae));
	assertEqualInt(1456747, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, sizeof(buff)));

	/* Verify encrypted file "NEWS" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("NEWS", archive_entry_pathname(ae));
	assertEqualInt(29357, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, sizeof(buff)));

	/* Verify encrypted file "README" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("README", archive_entry_pathname(ae));
	assertEqualInt(6818, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, sizeof(buff)));

	/* Verify encrypted file "config.h" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("config.h", archive_entry_pathname(ae));
	assertEqualInt(32667, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, sizeof(buff)));

	assertEqualInt(4, archive_file_count(a));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));


	/*
	 * Extract a zip file with password.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_read_add_passphrase(a, "password"));
	assertEqualIntA(a, ARCHIVE_OK, 
		archive_read_open_filename(a, refname, 10240));

	assertEqualIntA(a, ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW,
		archive_read_has_encrypted_entries(a));

	/* Verify encrypted file "Makefile" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("Makefile", archive_entry_pathname(ae));
	assertEqualInt(1456747, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	if (archive_zlib_version() != NULL) {
		assertEqualInt(512, archive_read_data(a, buff, sizeof(buff)));
	} else {
		assertEqualInt(ARCHIVE_FAILED,
			archive_read_data(a, buff, sizeof(buff)));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (8: deflation)");
		assert(archive_errno(a) != 0);
	}

	/* Verify encrypted file "NEWS" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("NEWS", archive_entry_pathname(ae));
	assertEqualInt(29357, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	if (archive_zlib_version() != NULL) {
		assertEqualInt(512, archive_read_data(a, buff, sizeof(buff)));
	} else {
		assertEqualInt(ARCHIVE_FAILED,
			archive_read_data(a, buff, sizeof(buff)));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (8: deflation)");
		assert(archive_errno(a) != 0);
	}

	/* Verify encrypted file "README" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("README", archive_entry_pathname(ae));
	assertEqualInt(6818, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	if (archive_zlib_version() != NULL) {
		assertEqualInt(512, archive_read_data(a, buff, sizeof(buff)));
	} else {
		assertEqualInt(ARCHIVE_FAILED,
			archive_read_data(a, buff, sizeof(buff)));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (8: deflation)");
		assert(archive_errno(a) != 0);
	}

	/* Verify encrypted file "config.h" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("config.h", archive_entry_pathname(ae));
	assertEqualInt(32667, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	if (archive_zlib_version() != NULL) {
		assertEqualInt(512, archive_read_data(a, buff, sizeof(buff)));
	} else {
		assertEqualInt(ARCHIVE_FAILED,
			archive_read_data(a, buff, sizeof(buff)));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (8: deflation)");
		assert(archive_errno(a) != 0);
	}
	
	assertEqualInt(4, archive_file_count(a));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}